

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

optional<tinyusdz::Orientation> *
tinyusdz::OrientationFromString(optional<tinyusdz::Orientation> *__return_storage_ptr__,string *v)

{
  bool bVar1;
  Orientation local_20 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *v_local;
  
  local_18 = v;
  v_local = (string *)__return_storage_ptr__;
  bVar1 = ::std::operator==("rightHanded",v);
  if (bVar1) {
    local_20[1] = 0;
    nonstd::optional_lite::optional<tinyusdz::Orientation>::optional<tinyusdz::Orientation,_0>
              (__return_storage_ptr__,local_20 + 1);
  }
  else {
    bVar1 = ::std::operator==("leftHanded",local_18);
    if (bVar1) {
      local_20[0] = LeftHanded;
      nonstd::optional_lite::optional<tinyusdz::Orientation>::optional<tinyusdz::Orientation,_0>
                (__return_storage_ptr__,local_20);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::Orientation>::optional(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Orientation> OrientationFromString(const std::string &v) {
  if ("rightHanded" == v) {
    return Orientation::RightHanded;
  } else if ("leftHanded" == v) {
    return Orientation::LeftHanded;
  }
  return nonstd::nullopt;
}